

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-chat.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  ostream *poVar2;
  runtime_error *this;
  _Alloc_hider _Var3;
  ulong uVar4;
  initializer_list<common_chat_msg> __l;
  initializer_list<common_chat_msg> __l_00;
  initializer_list<common_chat_msg> __l_01;
  initializer_list<common_chat_msg> __l_02;
  common_chat_templates_ptr tmpls;
  value_type name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string format;
  string path;
  common_chat_templates_inputs inputs;
  vector<common_chat_msg,_std::allocator<common_chat_msg>_> msgs2;
  undefined1 local_818 [112];
  undefined1 local_7a8 [32];
  common_chat_msg msg;
  common_chat_msg local_6b8;
  common_chat_msg local_5e8;
  common_chat_msg local_518;
  common_chat_msg local_448;
  common_chat_msg local_378;
  common_chat_msg local_2a8;
  common_chat_msg local_1d8;
  common_chat_msg local_108;
  
  if (1 < argc) {
    inputs.grammar._M_dataplus._M_p = (pointer)&inputs.grammar.field_2;
    inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    inputs.grammar._M_string_length = 0;
    inputs.grammar.field_2._M_local_buf[0] = '\0';
    inputs.json_schema._M_dataplus._M_p = (pointer)&inputs.json_schema.field_2;
    inputs.json_schema._M_string_length = 0;
    inputs.json_schema.field_2._M_local_buf[0] = '\0';
    msg.role._M_dataplus._M_p = (pointer)&msg.role.field_2;
    msg.role._M_string_length = 0;
    inputs.add_generation_prompt = true;
    inputs.use_jinja = true;
    msg.role.field_2._M_allocated_capacity =
         msg.role.field_2._M_allocated_capacity & 0xffffffffffffff00;
    msg.content._M_dataplus._M_p = (pointer)&msg.content.field_2;
    msg.content._M_string_length = 0;
    msg.content.field_2._M_local_buf[0] = '\0';
    msg.reasoning_content._M_dataplus._M_p = (pointer)&msg.reasoning_content.field_2;
    msg.content_parts.
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    msg.content_parts.
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    msg.content_parts.
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg.tool_calls.super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    msg.tool_calls.super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    msg.tool_calls.super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg.reasoning_content._M_string_length = 0;
    inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
    super__Vector_impl_data._M_finish._0_5_ = 0;
    inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
    super__Vector_impl_data._M_finish._5_3_ = 0;
    inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
    inputs._117_8_ = 0;
    msg.reasoning_content.field_2._M_local_buf[0] = '\0';
    msg.tool_name._M_dataplus._M_p = (pointer)&msg.tool_name.field_2;
    msg.tool_name._M_string_length = 0;
    inputs.extract_reasoning = true;
    msg.tool_name.field_2._M_local_buf[0] = '\0';
    msg.tool_call_id._M_dataplus._M_p = (pointer)&msg.tool_call_id.field_2;
    msg.tool_call_id._M_string_length = 0;
    msg.tool_call_id.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&msg);
    std::__cxx11::string::assign((char *)&msg.content);
    common_chat_msg::common_chat_msg((common_chat_msg *)&msgs2,&msg);
    std::vector<common_chat_msg,std::allocator<common_chat_msg>>::
    _M_assign_aux<common_chat_msg_const*>
              ((vector<common_chat_msg,std::allocator<common_chat_msg>> *)&inputs,&msgs2,local_7a8);
    common_chat_msg::~common_chat_msg((common_chat_msg *)&msgs2);
    common_chat_tool::common_chat_tool((common_chat_tool *)&msgs2,&special_function_tool);
    std::vector<common_chat_tool,std::allocator<common_chat_tool>>::
    _M_assign_aux<common_chat_tool_const*>
              ((vector<common_chat_tool,std::allocator<common_chat_tool>> *)&inputs.tools,&msgs2,
               local_818);
    common_chat_tool::~common_chat_tool((common_chat_tool *)&msgs2);
    std::operator<<((ostream *)&std::cout,"| Template | Format |\n");
    std::operator<<((ostream *)&std::cout,"|----------|--------|\n");
    for (uVar4 = 1; (uint)argc != uVar4; uVar4 = uVar4 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&path,argv[uVar4],(allocator<char> *)&msgs2);
      lVar1 = std::__cxx11::string::rfind((char *)&path,0x1a5e16);
      if (lVar1 == path._M_string_length - 6) {
        read_templates((string *)&tmpls);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msgs2,"/",(allocator<char> *)&name);
        string_split(&parts,&path,(string *)&msgs2);
        std::__cxx11::string::~string((string *)&msgs2);
        std::__cxx11::string::string
                  ((string *)&name,
                   (string *)
                   (parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1));
        common_chat_templates_apply
                  ((common_chat_params *)&msgs2,
                   (common_chat_templates *)
                   tmpls._M_t.
                   super___uniq_ptr_impl<common_chat_templates,_common_chat_templates_deleter>._M_t.
                   super__Tuple_impl<0UL,_common_chat_templates_*,_common_chat_templates_deleter>.
                   super__Head_base<0UL,_common_chat_templates_*,_false>._M_head_impl,&inputs);
        common_chat_format_name_abi_cxx11_
                  (&format,(common_chat_format)
                           msgs2.
                           super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        common_chat_params::~common_chat_params((common_chat_params *)&msgs2);
        poVar2 = std::operator<<((ostream *)&std::cout,"| ");
        poVar2 = std::operator<<(poVar2,(string *)&name);
        poVar2 = std::operator<<(poVar2," | ");
        poVar2 = std::operator<<(poVar2,(string *)&format);
        std::operator<<(poVar2," |\n");
        std::__cxx11::string::~string((string *)&format);
        std::__cxx11::string::~string((string *)&name);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parts);
        std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::~unique_ptr(&tmpls);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Skipping non-jinja file: ");
        poVar2 = std::operator<<(poVar2,(string *)&path);
        std::operator<<(poVar2,'\n');
      }
      std::__cxx11::string::~string((string *)&path);
    }
    common_chat_msg::~common_chat_msg(&msg);
    common_chat_templates_inputs::~common_chat_templates_inputs(&inputs);
    return 0;
  }
  common_chat_msg::common_chat_msg(&msg,&message_user);
  common_chat_msg::common_chat_msg(&local_6b8,&message_user_parts);
  common_chat_msg::common_chat_msg(&local_5e8,&message_assist_call);
  common_chat_msg::common_chat_msg(&local_518,&message_assist_call_thoughts);
  common_chat_msg::common_chat_msg(&local_448,&message_assist_call_thoughts_unparsed);
  common_chat_msg::common_chat_msg(&local_378,&message_assist_call_id);
  common_chat_msg::common_chat_msg(&local_2a8,&message_assist_call_idx);
  common_chat_msg::common_chat_msg(&local_1d8,&message_assist_call_python);
  common_chat_msg::common_chat_msg(&local_108,&message_assist_call_code_interpreter);
  __l._M_len = 9;
  __l._M_array = &msg;
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::vector
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&path,__l,
             (allocator_type *)&msgs2);
  lVar1 = 0x680;
  do {
    common_chat_msg::~common_chat_msg((common_chat_msg *)((long)&msg.role._M_dataplus._M_p + lVar1))
    ;
    lVar1 = lVar1 + -0xd0;
  } while (lVar1 != -0xd0);
  for (_Var3 = path._M_dataplus; _Var3._M_p != (pointer)path._M_string_length;
      _Var3._M_p = _Var3._M_p + 0xd0) {
    common_chat_msg::common_chat_msg(&msg,(common_chat_msg *)_Var3._M_p);
    __l_00._M_len = 1;
    __l_00._M_array = &msg;
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::vector
              (&msgs2,__l_00,(allocator_type *)&name);
    common_chat_msgs_to_json_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              (&inputs.messages,SUB81(&msgs2,0));
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector(&msgs2);
    common_chat_msg::~common_chat_msg(&msg);
    common_chat_msgs_parse_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              (&msgs2,(json *)&inputs);
    msg.role._M_dataplus._M_p = (pointer)0x1;
    name._M_dataplus._M_p =
         (pointer)(((long)msgs2.
                          super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)msgs2.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0xd0);
    assert_equals<unsigned_long>((unsigned_long *)&msg,(unsigned_long *)&name);
    common_chat_msg::common_chat_msg
              (&msg,msgs2.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    assert_msg_equals((common_chat_msg *)_Var3._M_p,&msg);
    common_chat_msg::~common_chat_msg(&msg);
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector(&msgs2);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&inputs);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msgs2,
             "[\n  {\n    \"role\": \"user\",\n    \"content\": [\n      {\n        \"type\": \"text\",\n        \"text\": \"Hey\"\n      },\n      {\n        \"type\": \"text\",\n        \"text\": \"there\"\n      }\n    ]\n  }\n]"
             ,(allocator<char> *)&parts);
  common_chat_msg::common_chat_msg(&msg,&message_user_parts);
  __l_01._M_len = 1;
  __l_01._M_array = &msg;
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::vector
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&name,__l_01,
             (allocator_type *)&tmpls);
  common_chat_msgs_to_json_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&format,SUB81(&name,0));
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::dump((string_t *)&inputs,
         (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)&format,2,' ',false,strict);
  assert_equals<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgs2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inputs);
  std::__cxx11::string::~string((string *)&inputs);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)&format);
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&name);
  common_chat_msg::~common_chat_msg(&msg);
  std::__cxx11::string::~string((string *)&msgs2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msgs2,
             "[\n  {\n    \"role\": \"assistant\",\n    \"content\": null,\n    \"tool_calls\": [\n      {\n        \"type\": \"function\",\n        \"function\": {\n          \"name\": \"python\",\n          \"arguments\": \"{\\\"code\\\": \\\"print(\'hey\')\\\"}\"\n        }\n      }\n    ]\n  }\n]"
             ,(allocator<char> *)&parts);
  common_chat_msg::common_chat_msg(&msg,&message_assist_call_python);
  __l_02._M_len = 1;
  __l_02._M_array = &msg;
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::vector
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&name,__l_02,
             (allocator_type *)&tmpls);
  common_chat_msgs_to_json_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&format,SUB81(&name,0));
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::dump((string_t *)&inputs,
         (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)&format,2,' ',false,strict);
  assert_equals<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgs2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inputs);
  std::__cxx11::string::~string((string *)&inputs);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)&format);
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&name);
  common_chat_msg::~common_chat_msg(&msg);
  std::__cxx11::string::~string((string *)&msgs2);
  msg.role._M_dataplus._M_p = (pointer)0x0;
  msg.role._M_string_length = 0;
  msg.role.field_2._M_allocated_capacity = 0;
  msg.role.field_2._8_8_ = 0;
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<char_const(&)[42]>
            ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)&msgs2,(char (*) [42])"[{\"role\": \"assistant\", \"tool_calls\": []}]",
             (parser_callback_t *)&msg,true,false);
  common_chat_msgs_parse_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&name,(json *)&msgs2);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)&msgs2);
  std::_Function_base::~_Function_base((_Function_base *)&msg);
  msgs2.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)(name._M_string_length - (long)name._M_dataplus._M_p) / 0xd0);
  assert_equals<unsigned_long>((unsigned_long *)&msgs2,(unsigned_long *)&inputs);
  _Var3 = name._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msgs2,"assistant",(allocator<char> *)&inputs);
  assert_equals<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var3._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgs2);
  std::__cxx11::string::~string((string *)&msgs2);
  msgs2.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(msgs2.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(inputs.messages.
                         super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         *(long *)(name._M_dataplus._M_p + 0x28) == 0);
  assert_equals<bool>((bool *)&msgs2,(bool *)&inputs);
  msgs2.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(msgs2.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(inputs.messages.
                         super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         *(long *)(name._M_dataplus._M_p + 0x58) ==
                         *(long *)(name._M_dataplus._M_p + 0x60));
  assert_equals<bool>((bool *)&msgs2,(bool *)&inputs);
  msgs2.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  msgs2.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msgs2.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<char_const(&)[24]>
            ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)&inputs,(char (*) [24])"[{\"role\": \"assistant\"}]",(parser_callback_t *)&msgs2,
             true,false);
  common_chat_msgs_parse_oaicompat<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&format,(json *)&inputs);
  std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::~vector
            ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)&format);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)&inputs);
  std::_Function_base::~_Function_base((_Function_base *)&msgs2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Expected exception");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char ** argv) {
    // try {
#ifndef _WIN32
        if (argc > 1) {
            common_chat_templates_inputs inputs;
            common_chat_msg msg;
            msg.role = "user";
            msg.content = "Hey";
            inputs.messages = {msg};
            inputs.tools = { special_function_tool };

            std::cout << "| Template | Format |\n";
            std::cout << "|----------|--------|\n";

            for (int i = 1; i < argc; i++) {
                try {
                    std::string path = argv[i];
                    if (path.rfind(".jinja") != path.size() - 6) {
                        std::cerr << "Skipping non-jinja file: " << path << '\n';
                        continue;
                    }
                    auto tmpls = read_templates(path);
                    auto parts  = string_split(path, "/");
                    auto name   = parts[parts.size() - 1];
                    auto format = common_chat_format_name(common_chat_templates_apply(tmpls.get(), inputs).format);
                    std::cout << "| " << name << " | " << format << " |\n";
                } catch (const std::exception & e) {
                    std::cerr << "Failed to process " << argv[i] << ": " << e.what() << '\n';
                }
            }
        } else
#endif
        {
            test_msgs_oaicompat_json_conversion();
            test_tools_oaicompat_json_conversion();
            test_template_output_parsers();
            std::cout << "\n[chat] All tests passed!" << '\n';
        }
        return 0;
    // } catch (const std::exception & e) {
    //     std::cerr << "Error: " << e.what() << '\n';
    //     return 1;
    // }
}